

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_block_mapping_value(yaml_emitter_t *emitter,yaml_event_t *event,int simple)

{
  yaml_emitter_state_t *pyVar1;
  int iVar2;
  int simple_local;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  if (simple == 0) {
    iVar2 = yaml_emitter_write_indent(emitter);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = yaml_emitter_write_indicator(emitter,":",1,0,1);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = yaml_emitter_write_indicator(emitter,":",0,0,0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  if (((emitter->states).top == (emitter->states).end) &&
     (iVar2 = yaml_stack_extend(&(emitter->states).start,&(emitter->states).top,
                                &(emitter->states).end), iVar2 == 0)) {
    emitter->error = YAML_MEMORY_ERROR;
    emitter_local._4_4_ = 0;
  }
  else {
    pyVar1 = (emitter->states).top;
    (emitter->states).top = pyVar1 + 1;
    *pyVar1 = YAML_EMIT_BLOCK_MAPPING_KEY_STATE;
    emitter_local._4_4_ = yaml_emitter_emit_node(emitter,event,0,0,1,0);
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_block_mapping_value(yaml_emitter_t *emitter,
        yaml_event_t *event, int simple)
{
    if (simple) {
        if (!yaml_emitter_write_indicator(emitter, ":", 0, 0, 0))
            return 0;
    }
    else {
        if (!yaml_emitter_write_indent(emitter))
            return 0;
        if (!yaml_emitter_write_indicator(emitter, ":", 1, 0, 1))
            return 0;
    }
    if (!PUSH(emitter, emitter->states,
                YAML_EMIT_BLOCK_MAPPING_KEY_STATE))
        return 0;

    return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 0);
}